

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

void Fraig_ReallocateSimulationInfo(Fraig_Man_t *p)

{
  uint uVar1;
  Fraig_Node_t *pFVar2;
  int iVar3;
  Fraig_MemFixed_t *p_00;
  uint *puVar4;
  int local_30;
  int i;
  uint uSignOld;
  uint *pSimsNew;
  Fraig_Node_t *pNode;
  Fraig_MemFixed_t *mmSimsNew;
  Fraig_Man_t *p_local;
  
  p->nWordsDyna = p->nWordsDyna << 1;
  p_00 = Fraig_MemFixedStart((p->nWordsRand + p->nWordsDyna) * 4);
  pFVar2 = p->pConst1;
  puVar4 = (uint *)Fraig_MemFixedEntryFetch(p_00);
  pFVar2->puSimR = puVar4;
  pFVar2->puSimD = pFVar2->puSimR + p->nWordsRand;
  memset(pFVar2->puSimR,0,(long)p->nWordsRand << 2);
  memset(pFVar2->puSimD,0,(long)p->nWordsDyna << 2);
  for (local_30 = 0; local_30 < p->vInputs->nSize; local_30 = local_30 + 1) {
    pFVar2 = p->vInputs->pArray[local_30];
    puVar4 = (uint *)Fraig_MemFixedEntryFetch(p_00);
    memmove(puVar4,pFVar2->puSimR,(long)(p->nWordsRand + p->iWordStart) << 2);
    pFVar2->puSimR = puVar4;
    pFVar2->puSimD = pFVar2->puSimR + p->nWordsRand;
  }
  Fraig_MemFixedStop(p->mmSims,0);
  p->mmSims = p_00;
  local_30 = 1;
  do {
    if (p->vNodes->nSize <= local_30) {
      puVar4 = (uint *)Fraig_MemFixedEntryFetch(p_00);
      p->pSimsReal = puVar4;
      memset(p->pSimsReal,0,(long)p->nWordsDyna << 2);
      puVar4 = (uint *)Fraig_MemFixedEntryFetch(p_00);
      p->pSimsTemp = puVar4;
      puVar4 = (uint *)Fraig_MemFixedEntryFetch(p_00);
      p->pSimsDiff = puVar4;
      return;
    }
    pFVar2 = p->vNodes->pArray[local_30];
    iVar3 = Fraig_NodeIsAnd(pFVar2);
    if (iVar3 != 0) {
      puVar4 = (uint *)Fraig_MemFixedEntryFetch(p_00);
      pFVar2->puSimR = puVar4;
      pFVar2->puSimD = pFVar2->puSimR + p->nWordsRand;
      uVar1 = pFVar2->uHashR;
      pFVar2->uHashR = 0;
      Fraig_NodeSimulate(pFVar2,0,p->nWordsRand,1);
      if (uVar1 != pFVar2->uHashR) {
        __assert_fail("uSignOld == pNode->uHashR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,0x2f8,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
      }
      uVar1 = pFVar2->uHashD;
      pFVar2->uHashD = 0;
      Fraig_NodeSimulate(pFVar2,0,p->iWordStart,0);
      if (uVar1 != pFVar2->uHashD) {
        __assert_fail("uSignOld == pNode->uHashD",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,0x2fd,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Fraig_ReallocateSimulationInfo( Fraig_Man_t * p )
{
    Fraig_MemFixed_t * mmSimsNew;        // new memory manager for simulation info
    Fraig_Node_t * pNode;
    unsigned * pSimsNew;
    unsigned uSignOld;
    int i;

    // allocate a new memory manager
    p->nWordsDyna *= 2;
    mmSimsNew = Fraig_MemFixedStart( sizeof(unsigned) * (p->nWordsRand + p->nWordsDyna) );

    // set the new data for the constant node
    pNode = p->pConst1;
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( mmSimsNew );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    memset( pNode->puSimR, 0, sizeof(unsigned) * p->nWordsRand );
    memset( pNode->puSimD, 0, sizeof(unsigned) * p->nWordsDyna );

    // copy the simulation info of the PIs
    for ( i = 0; i < p->vInputs->nSize; i++ )
    {
        pNode = p->vInputs->pArray[i];
        // copy the simulation info
        pSimsNew = (unsigned *)Fraig_MemFixedEntryFetch( mmSimsNew );
        memmove( pSimsNew, pNode->puSimR, sizeof(unsigned) * (p->nWordsRand + p->iWordStart) );
        // attach the new info
        pNode->puSimR = pSimsNew;
        pNode->puSimD = pNode->puSimR + p->nWordsRand;
        // signatures remain without changes
    }

    // replace the manager to free up some memory
    Fraig_MemFixedStop( p->mmSims, 0 );
    p->mmSims = mmSimsNew;

    // resimulate the internal nodes (this should lead to the same signatures)
    for ( i = 1; i < p->vNodes->nSize; i++ )
    {
        pNode = p->vNodes->pArray[i];
        if ( !Fraig_NodeIsAnd(pNode) )
            continue;
        // allocate memory for the simulation info
        pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( mmSimsNew );
        pNode->puSimD = pNode->puSimR + p->nWordsRand;
        // derive random simulation info
        uSignOld = pNode->uHashR;
        pNode->uHashR = 0;
        Fraig_NodeSimulate( pNode, 0, p->nWordsRand, 1 );
        assert( uSignOld == pNode->uHashR );
        // derive dynamic simulation info
        uSignOld = pNode->uHashD;
        pNode->uHashD = 0;
        Fraig_NodeSimulate( pNode, 0, p->iWordStart, 0 );
        assert( uSignOld == pNode->uHashD );
    }

    // realloc temporary storage
    p->pSimsReal = (unsigned *)Fraig_MemFixedEntryFetch( mmSimsNew );
    memset( p->pSimsReal, 0, sizeof(unsigned) * p->nWordsDyna );
    p->pSimsTemp = (unsigned *)Fraig_MemFixedEntryFetch( mmSimsNew );
    p->pSimsDiff = (unsigned *)Fraig_MemFixedEntryFetch( mmSimsNew );
}